

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

double __thiscall nnad::Matrix<double>::Determinant(Matrix<double> *this)

{
  int *in_RDI;
  double dVar1;
  double dVar2;
  Matrix<double> Cofactor;
  int f;
  int sign;
  double D;
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  int local_60;
  int local_5c;
  double local_50;
  int *in_stack_ffffffffffffffc0;
  int *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  Matrix<double> *in_stack_ffffffffffffffd8;
  Matrix<double> *in_stack_ffffffffffffffe8;
  double local_8;
  
  if (*in_RDI != in_RDI[1]) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    Error((string *)0x102fc1);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  }
  local_50 = 0.0;
  if (*in_RDI == 1) {
    local_8 = GetElement((Matrix<double> *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  else {
    local_5c = 1;
    for (local_60 = 0; local_60 < *in_RDI; local_60 = local_60 + 1) {
      GetCofactor(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
      dVar1 = GetElement((Matrix<double> *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                         in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
      dVar2 = Determinant(in_stack_ffffffffffffffe8);
      local_50 = (double)local_5c * dVar1 * dVar2 + local_50;
      local_5c = -local_5c;
      ~Matrix((Matrix<double> *)0x103121);
    }
    local_8 = local_50;
  }
  return local_8;
}

Assistant:

T Determinant()
    {
      if (_Lines != _Columns)
        Error("Determinant: matrix must be square.");

      T D = 0; // Initialize result

      //  Base case : if matrix contains single element
      if (_Lines == 1)
        return this->GetElement(0,0);

      // To store sign multiplier
      int sign = 1;

      // Iterate for each element of first row
      for (int f = 0; f < _Lines; f++)
        {
          // Getting Cofactor
          Matrix<T> Cofactor = this->GetCofactor(0, f);
          D += sign * this->GetElement(0, f) * Cofactor.Determinant();

          // terms are to be added with alternate sign
          sign = -sign;
        }
      return D;
    }